

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ssl_setup_pake_shares(SSL_HANDSHAKE *hs)

{
  undefined1 *this;
  StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *this_00;
  Span<const_unsigned_char> id_verifier;
  Span<const_unsigned_char> w0;
  Span<const_unsigned_char> w1;
  Span<const_unsigned_char> x;
  bool bVar1;
  int iVar2;
  pointer this_01;
  unique_ptr<ssl_credential_st,_bssl::internal::Deleter> *puVar3;
  size_t sVar4;
  pointer v;
  pointer pPVar5;
  cbb_st *pcVar6;
  uchar *puVar7;
  undefined1 local_1f0 [8];
  CBB pake_message;
  CBB server_identity;
  CBB client_identity;
  CBB shares;
  ScopedCBB cbb;
  Span<unsigned_char> local_f8;
  Span<const_unsigned_char> local_e8;
  uchar *local_d8;
  size_t local_d0;
  uchar *local_c8;
  size_t local_c0;
  uchar *local_b8;
  size_t local_b0;
  Span<const_unsigned_char> local_a8;
  Span<const_unsigned_char> local_98;
  uchar local_88 [8];
  uint8_t prover_share [65];
  SSL_CREDENTIAL *cred;
  Vector<std::unique_ptr<ssl_credential_st,_bssl::internal::Deleter>_> *creds;
  SSL_HANDSHAKE *hs_local;
  
  Array<unsigned_char>::Reset(&hs->pake_share_bytes);
  if (hs->max_version < 0x304) {
    return true;
  }
  this_01 = std::unique_ptr<bssl::CERT,_bssl::internal::Deleter>::operator->(&hs->config->cert);
  puVar3 = Vector<std::unique_ptr<ssl_credential_st,_bssl::internal::Deleter>_>::begin
                     (&this_01->credentials);
  Vector<std::unique_ptr<ssl_credential_st,_bssl::internal::Deleter>_>::end(&this_01->credentials);
  bVar1 = std::
          none_of<std::unique_ptr<ssl_credential_st,bssl::internal::Deleter>const*,bssl::ssl_setup_pake_shares(bssl::SSL_HANDSHAKE*)::__0>
                    (puVar3);
  if (bVar1) {
    return true;
  }
  sVar4 = Vector<std::unique_ptr<ssl_credential_st,_bssl::internal::Deleter>_>::size
                    (&this_01->credentials);
  if (sVar4 != 1) {
    ERR_put_error(0x10,0,0x147,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                  ,0xc12);
    return false;
  }
  puVar3 = Vector<std::unique_ptr<ssl_credential_st,_bssl::internal::Deleter>_>::operator[]
                     (&this_01->credentials,0);
  v = std::unique_ptr<ssl_credential_st,_bssl::internal::Deleter>::get(puVar3);
  if (v->type != kSPAKE2PlusV1Client) {
    __assert_fail("cred->type == SSLCredentialType::kSPAKE2PlusV1Client",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                  ,0xc16,"bool bssl::ssl_setup_pake_shares(SSL_HANDSHAKE *)");
  }
  MakeUnique<bssl::spake2plus::Prover>();
  std::unique_ptr<bssl::spake2plus::Prover,_bssl::internal::Deleter>::operator=
            (&hs->pake_prover,
             (unique_ptr<bssl::spake2plus::Prover,_bssl::internal::Deleter> *)(prover_share + 0x40))
  ;
  std::unique_ptr<bssl::spake2plus::Prover,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bssl::spake2plus::Prover,_bssl::internal::Deleter> *)(prover_share + 0x40))
  ;
  bVar1 = std::operator==(&hs->pake_prover,(nullptr_t)0x0);
  if (bVar1) {
    return false;
  }
  pPVar5 = std::unique_ptr<bssl::spake2plus::Prover,_bssl::internal::Deleter>::operator->
                     (&hs->pake_prover);
  Span<unsigned_char_const>::Span<bssl::Array<unsigned_char>,void,bssl::Array<unsigned_char>>
            ((Span<unsigned_char_const> *)&local_98,&v->pake_context);
  Span<unsigned_char_const>::Span<bssl::Array<unsigned_char>,void,bssl::Array<unsigned_char>>
            ((Span<unsigned_char_const> *)&local_a8,&v->client_identity);
  Span<unsigned_char_const>::Span<bssl::Array<unsigned_char>,void,bssl::Array<unsigned_char>>
            ((Span<unsigned_char_const> *)&local_b8,&v->server_identity);
  Span<unsigned_char_const>::Span<bssl::Array<unsigned_char>,void,bssl::Array<unsigned_char>>
            ((Span<unsigned_char_const> *)&local_c8,&v->password_verifier_w0);
  Span<unsigned_char_const>::Span<bssl::Array<unsigned_char>,void,bssl::Array<unsigned_char>>
            ((Span<unsigned_char_const> *)&local_d8,&v->password_verifier_w1);
  Span<const_unsigned_char>::Span(&local_e8);
  id_verifier.size_ = local_b0;
  id_verifier.data_ = local_b8;
  w0.size_ = local_c0;
  w0.data_ = local_c8;
  w1.size_ = local_d0;
  w1.data_ = local_d8;
  x.size_ = local_e8.size_;
  x.data_ = local_e8.data_;
  bVar1 = spake2plus::Prover::Init(pPVar5,local_98,local_a8,id_verifier,w0,w1,x);
  if (!bVar1) {
    return false;
  }
  pPVar5 = std::unique_ptr<bssl::spake2plus::Prover,_bssl::internal::Deleter>::operator->
                     (&hs->pake_prover);
  Span<unsigned_char>::Span<65ul>(&local_f8,(uchar (*) [65])local_88);
  bVar1 = spake2plus::Prover::GenerateShare(pPVar5,local_f8);
  if (!bVar1) {
    return false;
  }
  this = &cbb.ctx_.u.base.field_0x18;
  UpRef((bssl *)this,v);
  std::unique_ptr<ssl_credential_st,_bssl::internal::Deleter>::operator=
            (&hs->credential,(unique_ptr<ssl_credential_st,_bssl::internal::Deleter> *)this);
  std::unique_ptr<ssl_credential_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_credential_st,_bssl::internal::Deleter> *)this);
  this_00 = (StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)((long)&shares.u + 0x18);
  internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::StackAllocated(this_00);
  pcVar6 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get(this_00);
  iVar2 = CBB_init(pcVar6,0x40);
  if (iVar2 != 0) {
    pcVar6 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                       ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                        ((long)&shares.u + 0x18));
    iVar2 = CBB_add_u16_length_prefixed(pcVar6,(CBB *)((long)&server_identity.u + 0x18));
    if (iVar2 != 0) {
      puVar7 = Array<unsigned_char>::data(&v->client_identity);
      sVar4 = Array<unsigned_char>::size(&v->client_identity);
      iVar2 = CBB_add_bytes((CBB *)((long)&server_identity.u + 0x18),puVar7,sVar4);
      if (iVar2 != 0) {
        pcVar6 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                           ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                            ((long)&shares.u + 0x18));
        iVar2 = CBB_add_u16_length_prefixed(pcVar6,(CBB *)((long)&pake_message.u + 0x18));
        if (iVar2 != 0) {
          puVar7 = Array<unsigned_char>::data(&v->server_identity);
          sVar4 = Array<unsigned_char>::size(&v->server_identity);
          iVar2 = CBB_add_bytes((CBB *)((long)&pake_message.u + 0x18),puVar7,sVar4);
          if (iVar2 != 0) {
            pcVar6 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                               ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                                ((long)&shares.u + 0x18));
            iVar2 = CBB_add_u16_length_prefixed(pcVar6,(CBB *)((long)&client_identity.u + 0x18));
            if ((((iVar2 != 0) &&
                 (iVar2 = CBB_add_u16((CBB *)((long)&client_identity.u + 0x18),0x7d96), iVar2 != 0))
                && (iVar2 = CBB_add_u16_length_prefixed
                                      ((CBB *)((long)&client_identity.u + 0x18),(CBB *)local_1f0),
                   iVar2 != 0)) &&
               (iVar2 = CBB_add_bytes((CBB *)local_1f0,local_88,0x41), iVar2 != 0)) {
              pcVar6 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                                 ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                                  ((long)&shares.u + 0x18));
              hs_local._7_1_ = CBBFinishArray(pcVar6,&hs->pake_share_bytes);
              goto LAB_001671e0;
            }
          }
        }
      }
    }
  }
  hs_local._7_1_ = false;
LAB_001671e0:
  internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
            ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)((long)&shares.u + 0x18));
  return hs_local._7_1_;
}

Assistant:

bool ssl_setup_pake_shares(SSL_HANDSHAKE *hs) {
  hs->pake_share_bytes.Reset();
  if (hs->max_version < TLS1_3_VERSION) {
    return true;
  }

  const auto &creds = hs->config->cert->credentials;
  if (std::none_of(creds.begin(), creds.end(), [](const auto &cred) {
        return cred->type == SSLCredentialType::kSPAKE2PlusV1Client;
      })) {
    // If there were no configured PAKE credentials, proceed without filling
    // in the PAKE extension.
    return true;
  }

  // We currently do not support multiple PAKE credentials, or a mix of PAKE and
  // non-PAKE credentials.
  if (creds.size() != 1u) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_UNSUPPORTED_CREDENTIAL_LIST);
    return false;
  }
  SSL_CREDENTIAL *cred = creds[0].get();
  assert(cred->type == SSLCredentialType::kSPAKE2PlusV1Client);

  hs->pake_prover = MakeUnique<spake2plus::Prover>();
  uint8_t prover_share[spake2plus::kShareSize];
  if (hs->pake_prover == nullptr ||
      !hs->pake_prover->Init(cred->pake_context, cred->client_identity,
                             cred->server_identity, cred->password_verifier_w0,
                             cred->password_verifier_w1) ||
      !hs->pake_prover->GenerateShare(prover_share)) {
    return false;
  }

  hs->credential = UpRef(cred);

  bssl::ScopedCBB cbb;
  CBB shares, client_identity, server_identity, pake_message;
  if (!CBB_init(cbb.get(), 64) ||
      !CBB_add_u16_length_prefixed(cbb.get(), &client_identity) ||
      !CBB_add_bytes(&client_identity, cred->client_identity.data(),
                     cred->client_identity.size()) ||
      !CBB_add_u16_length_prefixed(cbb.get(), &server_identity) ||
      !CBB_add_bytes(&server_identity, cred->server_identity.data(),
                     cred->server_identity.size()) ||
      !CBB_add_u16_length_prefixed(cbb.get(), &shares) ||
      !CBB_add_u16(&shares, SSL_PAKE_SPAKE2PLUSV1) ||
      !CBB_add_u16_length_prefixed(&shares, &pake_message) ||
      !CBB_add_bytes(&pake_message, prover_share, sizeof(prover_share))) {
    return false;
  }

  return CBBFinishArray(cbb.get(), &hs->pake_share_bytes);
}